

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

StringRef Catch::trim(StringRef ref)

{
  byte bVar1;
  size_type shortened_size;
  ulong uVar2;
  ulong index;
  ulong in_RSI;
  char *in_RDI;
  size_type index_00;
  ulong uVar3;
  StringRef SVar4;
  StringRef local_38;
  
  index = 0;
  local_38.m_start = in_RDI;
  local_38.m_size = in_RSI;
  while (((index < local_38.m_size && (bVar1 = StringRef::operator[](&local_38,index), bVar1 < 0x21)
          ) && ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) != 0))) {
    index = index + 1;
  }
  uVar3 = local_38.m_size - index;
  index_00 = local_38.m_size;
  while (index < index_00) {
    index_00 = index_00 - 1;
    bVar1 = StringRef::operator[](&local_38,index_00);
    if ((0x20 < bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
    uVar3 = uVar3 - 1;
  }
  uVar2 = local_38.m_size - index;
  if (local_38.m_size < index || uVar2 == 0) {
    local_38.m_start = "";
    uVar3 = 0;
  }
  else {
    local_38.m_start = local_38.m_start + index;
    if (uVar2 < uVar3) {
      uVar3 = uVar2;
    }
  }
  SVar4.m_size = uVar3;
  SVar4.m_start = local_38.m_start;
  return SVar4;
}

Assistant:

StringRef trim(StringRef ref) {
        const auto is_ws = [](char c) {
            return c == ' ' || c == '\t' || c == '\n' || c == '\r';
        };
        size_t real_begin = 0;
        while (real_begin < ref.size() && is_ws(ref[real_begin])) { ++real_begin; }
        size_t real_end = ref.size();
        while (real_end > real_begin && is_ws(ref[real_end - 1])) { --real_end; }

        return ref.substr(real_begin, real_end - real_begin);
    }